

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::populateReaction(RunContext *this,AssertionReaction *reaction)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  byte *in_RSI;
  RunContext *in_RDI;
  bool local_11;
  
  peVar3 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x133554);
  iVar2 = (*(peVar3->super_NonCopyable)._vptr_NonCopyable[6])();
  *in_RSI = (byte)iVar2 & 1;
  bVar1 = aborting(in_RDI);
  local_11 = true;
  if (!bVar1) {
    local_11 = ((in_RDI->m_lastAssertionInfo).resultDisposition & Normal) != 0;
  }
  in_RSI[1] = local_11;
  return;
}

Assistant:

void RunContext::populateReaction( AssertionReaction& reaction ) {
        reaction.shouldDebugBreak = m_config->shouldDebugBreak();
        reaction.shouldThrow = aborting() || (m_lastAssertionInfo.resultDisposition & ResultDisposition::Normal);
    }